

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::ViewportArray::ScissorAPI::iterate(ScissorAPI *this)

{
  pointer *ppiVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  value_type vVar5;
  NotSupportedError *this_00;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  reference pvVar8;
  TestContext *pTVar9;
  int local_80;
  int local_7c;
  GLint i_4;
  GLint j_1;
  GLint j;
  GLint value;
  GLint i_3;
  GLint i_2;
  GLint i_1;
  GLint i;
  vector<int,_std::allocator<int>_> scissor_box_data_b;
  vector<int,_std::allocator<int>_> scissor_box_data_a;
  GLint max_viewports;
  bool test_result;
  Functions *gl;
  ScissorAPI *this_local;
  long lVar7;
  
  if (((this->super_TestCaseBase).m_is_viewport_array_supported & 1U) != 0) {
    pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    iVar3 = (*pRVar6->_vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var,iVar3);
    scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._7_1_ = 1;
    scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._0_4_ = 0;
    (**(code **)(lVar7 + 0x868))
              (0x825b,&scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x797);
    ppiVar1 = &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)ppiVar1);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i_1);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)ppiVar1,
               (ulong)(uint)((int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage << 2));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&i_1,
               (ulong)(uint)((int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage << 2));
    getScissorBoxes(this,(int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<int,_std::allocator<int>_> *)
                    &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    for (i_2 = 0; iVar3 = (int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
        i_2 < (int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage; i_2 = i_2 + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)(uint)(i_2 << 2));
      *pvVar8 = *pvVar8 + 1;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)(i_2 * 4 + 1));
      *pvVar8 = *pvVar8 + 1;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)(i_2 * 4 + 2));
      *pvVar8 = *pvVar8 + -1;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)(i_2 * 4 + 3));
      *pvVar8 = *pvVar8 + -1;
    }
    pcVar2 = *(code **)(lVar7 + 0x1298);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    (*pcVar2)(0,iVar3,pvVar8);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"scissorArrayv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x7b0);
    getScissorBoxes(this,(int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<int,_std::allocator<int>_> *)&i_1);
    compareScissorBoxes(this,(vector<int,_std::allocator<int>_> *)
                             &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<int,_std::allocator<int>_> *)&i_1,"scissorArrayv",
                        (bool *)((long)&scissor_box_data_a.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage + 7));
    for (i_3 = 0; i_3 < (int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage; i_3 = i_3 + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)(uint)(i_3 << 2));
      *pvVar8 = 4;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)(i_3 * 4 + 1));
      *pvVar8 = 4;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)(i_3 * 4 + 2));
      *pvVar8 = 8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)(i_3 * 4 + 3));
      *pvVar8 = 8;
      (**(code **)(lVar7 + 0x12a0))(i_3,4,4,8);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"scissorIndexed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x7c2);
      getScissorBoxes(this,(int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<int,_std::allocator<int>_> *)
                      &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      compareScissorBoxes(this,(vector<int,_std::allocator<int>_> *)
                               &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<int,_std::allocator<int>_> *)&i_1,"scissorIndexed",
                          (bool *)((long)&scissor_box_data_a.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage + 7));
    }
    for (value = 0;
        value < (int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage; value = value + 1) {
      ppiVar1 = &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)ppiVar1,(ulong)(uint)(value << 2));
      *pvVar8 = 8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)ppiVar1,(ulong)(value * 4 + 1));
      *pvVar8 = 8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)ppiVar1,(ulong)(value * 4 + 2));
      *pvVar8 = 0xc;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)ppiVar1,(ulong)(value * 4 + 3));
      *pvVar8 = 0xc;
      pcVar2 = *(code **)(lVar7 + 0x12a8);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)ppiVar1,(ulong)(uint)(value << 2));
      (*pcVar2)(value,pvVar8);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"scissorIndexedv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x7d5);
      getScissorBoxes(this,(int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<int,_std::allocator<int>_> *)&i_1);
      compareScissorBoxes(this,(vector<int,_std::allocator<int>_> *)
                               &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<int,_std::allocator<int>_> *)&i_1,"scissorIndexedv",
                          (bool *)((long)&scissor_box_data_a.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage + 7));
    }
    for (j = 0; j < (int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage; j = j + 1) {
      vVar5 = 4;
      if (j % 2 == 0) {
        vVar5 = 1;
      }
      for (i_4 = 0; local_7c = j, i_4 < j; i_4 = i_4 + 1) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)(uint)(i_4 << 2));
        *pvVar8 = vVar5;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)(i_4 * 4 + 1));
        *pvVar8 = vVar5;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)(i_4 * 4 + 2));
        *pvVar8 = vVar5;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)(i_4 * 4 + 3));
        *pvVar8 = vVar5;
      }
      while (iVar3 = (int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage, local_7c = local_7c + 1,
            local_7c <
            (int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)(uint)(local_7c * 4));
        *pvVar8 = vVar5;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)(local_7c * 4 + 1));
        *pvVar8 = vVar5;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)(local_7c * 4 + 2));
        *pvVar8 = vVar5;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&i_1,(ulong)(local_7c * 4 + 3));
        *pvVar8 = vVar5;
      }
      pcVar2 = *(code **)(lVar7 + 0x1298);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&i_1,0);
      (*pcVar2)(0,iVar3,pvVar8);
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"scissorArrayv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x7f5);
      getScissorBoxes(this,(int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<int,_std::allocator<int>_> *)
                      &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      compareScissorBoxes(this,(vector<int,_std::allocator<int>_> *)
                               &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<int,_std::allocator<int>_> *)&i_1,"scissorArrayv",
                          (bool *)((long)&scissor_box_data_a.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage + 7));
    }
    for (local_80 = 0;
        local_80 <
        (int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; local_80 = local_80 + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)(uint)(local_80 << 2));
      *pvVar8 = 0;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)(local_80 * 4 + 1));
      *pvVar8 = 0;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)(local_80 * 4 + 2));
      *pvVar8 = 1;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)(local_80 * 4 + 3));
      *pvVar8 = 1;
    }
    (**(code **)(lVar7 + 0x1290))(0,0,1);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"scissor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x808);
    getScissorBoxes(this,(int)scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<int,_std::allocator<int>_> *)&i_1);
    compareScissorBoxes(this,(vector<int,_std::allocator<int>_> *)
                             &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<int,_std::allocator<int>_> *)&i_1,"scissor",
                        (bool *)((long)&scissor_box_data_a.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage + 7));
    if ((scissor_box_data_a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 1) {
      pTVar9 = deqp::Context::getTestContext((this->super_TestCaseBase).m_context);
      tcu::TestContext::setTestResult(pTVar9,QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      pTVar9 = deqp::Context::getTestContext((this->super_TestCaseBase).m_context);
      tcu::TestContext::setTestResult(pTVar9,QP_TEST_RESULT_FAIL,"Fail");
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_1);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &scissor_box_data_b.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Viewport array functionality not supported, skipping","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0x78b);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestNode::IterateResult ScissorAPI::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result */
	bool test_result = true;

	GLint max_viewports = 0;

	gl.getIntegerv(GL_MAX_VIEWPORTS, &max_viewports);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::vector<GLint> scissor_box_data_a;
	std::vector<GLint> scissor_box_data_b;

	scissor_box_data_a.resize(max_viewports * m_n_elements);
	scissor_box_data_b.resize(max_viewports * m_n_elements);

	/*
	 *   - get initial dimensions of SCISSOR_BOX for all MAX_VIEWPORTS indices;
	 *   - change location and dimensions of all indices at once with
	 *   ScissorArrayv;
	 *   - get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	getScissorBoxes(max_viewports, scissor_box_data_a);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] += 1;
		scissor_box_data_a[i * m_n_elements + 1] += 1;
		scissor_box_data_a[i * m_n_elements + 2] -= 1;
		scissor_box_data_a[i * m_n_elements + 3] -= 1;
	}

	gl.scissorArrayv(0, max_viewports, &scissor_box_data_a[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "scissorArrayv");

	getScissorBoxes(max_viewports, scissor_box_data_b);
	compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorArrayv", test_result);

	/*
	 *   - for each index:
	 *     * modify with ScissorIndexed,
	 *     * get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_b[i * m_n_elements + 0] = 4;
		scissor_box_data_b[i * m_n_elements + 1] = 4;
		scissor_box_data_b[i * m_n_elements + 2] = 8;
		scissor_box_data_b[i * m_n_elements + 3] = 8;

		gl.scissorIndexed(i, 4, 4, 8, 8);
		GLU_EXPECT_NO_ERROR(gl.getError(), "scissorIndexed");

		getScissorBoxes(max_viewports, scissor_box_data_a);
		compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorIndexed", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify with ScissorIndexedv,
	 *     * get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] = 8;
		scissor_box_data_a[i * m_n_elements + 1] = 8;
		scissor_box_data_a[i * m_n_elements + 2] = 12;
		scissor_box_data_a[i * m_n_elements + 3] = 12;

		gl.scissorIndexedv(i, &scissor_box_data_a[i * m_n_elements]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "scissorIndexedv");

		getScissorBoxes(max_viewports, scissor_box_data_b);
		compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorIndexedv", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify all indices before and after current one with ScissorArrayv,
	 *     * get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		const GLint value = (0 == i % 2) ? 1 : 4;

		for (GLint j = 0; j < i; ++j)
		{
			scissor_box_data_b[j * m_n_elements + 0] = value;
			scissor_box_data_b[j * m_n_elements + 1] = value;
			scissor_box_data_b[j * m_n_elements + 2] = value;
			scissor_box_data_b[j * m_n_elements + 3] = value;
		}

		for (GLint j = i + 1; j < max_viewports; ++j)
		{
			scissor_box_data_b[j * m_n_elements + 0] = value;
			scissor_box_data_b[j * m_n_elements + 1] = value;
			scissor_box_data_b[j * m_n_elements + 2] = value;
			scissor_box_data_b[j * m_n_elements + 3] = value;
		}

		gl.scissorArrayv(0, max_viewports, &scissor_box_data_b[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "scissorArrayv");

		getScissorBoxes(max_viewports, scissor_box_data_a);
		compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissorArrayv", test_result);
	}

	/*
	 *   - change location and dimensions of all indices at once with Scissor;
	 *   - get SCISSOR_BOX for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] = 0;
		scissor_box_data_a[i * m_n_elements + 1] = 0;
		scissor_box_data_a[i * m_n_elements + 2] = 1;
		scissor_box_data_a[i * m_n_elements + 3] = 1;
	}

	gl.scissor(0, 0, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "scissor");

	getScissorBoxes(max_viewports, scissor_box_data_b);
	compareScissorBoxes(scissor_box_data_a, scissor_box_data_b, "scissor", test_result);

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}